

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSignal_POSIX.c
# Opt level: O1

UINT8 OSSignal_Wait(OS_SIGNAL *sig)

{
  int iVar1;
  UINT8 UVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)sig);
  UVar2 = 0xff;
  if (iVar1 == 0) {
    if (sig->state == '\0') {
      do {
        iVar1 = pthread_cond_wait((pthread_cond_t *)&sig->hCond,(pthread_mutex_t *)sig);
        if (sig->state != '\0') break;
      } while (iVar1 == 0);
      UVar2 = -(iVar1 != 0);
    }
    else {
      UVar2 = '\0';
    }
    sig->state = '\0';
    pthread_mutex_unlock((pthread_mutex_t *)sig);
  }
  return UVar2;
}

Assistant:

UINT8 OSSignal_Wait(OS_SIGNAL* sig)
{
	int retVal;
	
	retVal = pthread_mutex_lock(&sig->hMutex);
	if (retVal)
		return 0xFF;
	
	while(! sig->state && ! retVal)
		retVal = pthread_cond_wait(&sig->hCond, &sig->hMutex);
	sig->state = 0;	// reset signal after catching it successfully
	
	pthread_mutex_unlock(&sig->hMutex);
	return retVal ? 0xFF : 0x00;
}